

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

reference __thiscall
absl::InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>>::
emplace_back<S2ShapeIndexCell_const*>
          (InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>> *this,
          S2ShapeIndexCell **args)

{
  ulong uVar1;
  reference ppSVar2;
  ulong uVar3;
  InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>> *pIVar4;
  ulong uVar5;
  
  uVar1 = *(ulong *)this;
  uVar3 = uVar1 >> 1;
  if ((uVar1 & 1) == 0) {
    uVar5 = 6;
  }
  else {
    uVar5 = *(ulong *)(this + 8);
  }
  pIVar4 = this + 8;
  if (uVar5 < uVar3) {
    __assert_fail("s <= capacity()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                  ,0x217,
                  "reference absl::InlinedVector<const S2ShapeIndexCell *, 6>::emplace_back(Args &&...) [T = const S2ShapeIndexCell *, N = 6, A = std::allocator<const S2ShapeIndexCell *>, Args = <const S2ShapeIndexCell *>]"
                 );
  }
  if (uVar3 == uVar5) {
    ppSVar2 = GrowAndEmplaceBack<S2ShapeIndexCell_const*>(this,args);
    return ppSVar2;
  }
  if (uVar3 < uVar5) {
    if ((uVar1 & 1) != 0) {
      pIVar4 = *(InlinedVector<S2ShapeIndexCell_const*,6ul,std::allocator<S2ShapeIndexCell_const*>>
                 **)(this + 0x10);
    }
    *(ulong *)this = uVar1 + 2;
    *(S2ShapeIndexCell **)(pIVar4 + uVar3 * 8) = *args;
    return (reference)(pIVar4 + uVar3 * 8);
  }
  __assert_fail("s < capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x21b,
                "reference absl::InlinedVector<const S2ShapeIndexCell *, 6>::emplace_back(Args &&...) [T = const S2ShapeIndexCell *, N = 6, A = std::allocator<const S2ShapeIndexCell *>, Args = <const S2ShapeIndexCell *>]"
               );
}

Assistant:

reference emplace_back(Args&&... args) {
    size_type s = size();
    assert(s <= capacity());
    if (ABSL_PREDICT_FALSE(s == capacity())) {
      return GrowAndEmplaceBack(std::forward<Args>(args)...);
    }
    assert(s < capacity());

    pointer space;
    if (allocated()) {
      tag().set_allocated_size(s + 1);
      space = allocated_space();
    } else {
      tag().set_inline_size(s + 1);
      space = inlined_space();
    }
    return Construct(space + s, std::forward<Args>(args)...);
  }